

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fl_utf8.cxx
# Opt level: O0

int fl_access(char *f,int mode)

{
  int iVar1;
  int mode_local;
  char *f_local;
  
  iVar1 = access(f,mode);
  return iVar1;
}

Assistant:

int fl_access(const char* f, int mode) {

#if defined (WIN32) && !defined(__CYGWIN__) // Windows

  size_t l = strlen(f);
  unsigned wn = fl_utf8toUtf16(f, (unsigned) l, NULL, 0) + 1; // Query length
  wbuf = (xchar*)realloc(wbuf, sizeof(xchar)*wn);
  wn = fl_utf8toUtf16(f, (unsigned) l, (unsigned short *)wbuf, wn); // Convert string
  wbuf[wn] = 0;
  return _waccess(wbuf, mode);

#else // other platforms

  return access(f, mode);

#endif

}